

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O2

void si9ma::SinglyLinkedList::print_list(SinglyNodeWithRand *head,string *separator)

{
  ostream *poVar1;
  
  for (; head != (SinglyNodeWithRand *)0x0; head = head->next) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->value);
    std::operator<<(poVar1,(string *)separator);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void SinglyLinkedList::print_list(SinglyNodeWithRand *head,string separator) {
        while (head != nullptr){
            std::cout << head->value << separator;
            head = head->next;
        }

        std::cout << std::endl;
    }